

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_catalog.c
# Opt level: O3

HPDF_UINT HPDF_Catalog_GetViewerPreference(HPDF_Catalog catalog)

{
  HPDF_Dict dict;
  void *pvVar1;
  HPDF_UINT HVar2;
  HPDF_UINT HVar3;
  
  dict = (HPDF_Dict)HPDF_Dict_GetItem(catalog,"ViewerPreferences",0x11);
  if (dict == (HPDF_Dict)0x0) {
    HVar3 = 0;
  }
  else {
    pvVar1 = HPDF_Dict_GetItem(dict,"HideToolbar",3);
    HVar3 = 0;
    if (pvVar1 != (void *)0x0) {
      HVar3 = (HPDF_UINT)(*(int *)((long)pvVar1 + 8) != 0);
    }
    pvVar1 = HPDF_Dict_GetItem(dict,"HideMenubar",3);
    HVar2 = HVar3;
    if ((pvVar1 != (void *)0x0) && (HVar2 = HVar3 + 2, *(int *)((long)pvVar1 + 8) == 0)) {
      HVar2 = HVar3;
    }
    pvVar1 = HPDF_Dict_GetItem(dict,"HideWindowUI",3);
    HVar3 = HVar2;
    if ((pvVar1 != (void *)0x0) && (HVar3 = HVar2 + 4, *(int *)((long)pvVar1 + 8) == 0)) {
      HVar3 = HVar2;
    }
    pvVar1 = HPDF_Dict_GetItem(dict,"FitWindow",3);
    HVar2 = HVar3;
    if ((pvVar1 != (void *)0x0) && (HVar2 = HVar3 + 8, *(int *)((long)pvVar1 + 8) == 0)) {
      HVar2 = HVar3;
    }
    pvVar1 = HPDF_Dict_GetItem(dict,"CenterWindow",3);
    HVar3 = HVar2;
    if ((pvVar1 != (void *)0x0) && (HVar3 = HVar2 + 0x10, *(int *)((long)pvVar1 + 8) == 0)) {
      HVar3 = HVar2;
    }
  }
  return HVar3;
}

Assistant:

HPDF_UINT
HPDF_Catalog_GetViewerPreference  (HPDF_Catalog   catalog)
{
    HPDF_Dict preferences;
    HPDF_UINT value = 0;
    HPDF_Boolean obj;

    HPDF_PTRACE ((" HPDF_Catalog_GetViewerPreference\n"));

    preferences = (HPDF_Dict)HPDF_Dict_GetItem (catalog, "ViewerPreferences",
            HPDF_OCLASS_DICT);

    if (!preferences)
        return 0;

    obj = (HPDF_Boolean)HPDF_Dict_GetItem (preferences, "HideToolbar",
            HPDF_OCLASS_BOOLEAN);
    if (obj) {
        if (obj->value)
            value += HPDF_HIDE_TOOLBAR;
    }

    obj = (HPDF_Boolean)HPDF_Dict_GetItem (preferences, "HideMenubar",
            HPDF_OCLASS_BOOLEAN);
    if (obj) {
        if (obj->value)
            value += HPDF_HIDE_MENUBAR;
    }

    obj = (HPDF_Boolean)HPDF_Dict_GetItem (preferences, "HideWindowUI",
            HPDF_OCLASS_BOOLEAN);
    if (obj) {
        if (obj->value)
            value += HPDF_HIDE_WINDOW_UI;
    }

    obj = (HPDF_Boolean)HPDF_Dict_GetItem (preferences, "FitWindow",
            HPDF_OCLASS_BOOLEAN);
    if (obj) {
        if (obj->value)
            value += HPDF_FIT_WINDOW;
    }

    obj = (HPDF_Boolean)HPDF_Dict_GetItem (preferences, "CenterWindow",
            HPDF_OCLASS_BOOLEAN);
    if (obj) {
        if (obj->value)
            value += HPDF_CENTER_WINDOW;
    }

    return value;
}